

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O3

void __thiscall Rml::ScrollController::UpdateSmoothscroll(ScrollController *this,float dp_ratio)

{
  double dVar1;
  code *pcVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  SystemInterface *pSVar7;
  Tween *pTVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector2f VVar15;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  Vector2f VVar16;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  Vector2f scroll_distance;
  float local_a8;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  undefined8 local_48;
  undefined8 uStack_40;
  Vector2f local_30;
  
  if (((this->mode != Smoothscroll) || (this->target == (Element *)0x0)) &&
     (bVar6 = Assert("RMLUI_ASSERT(mode == Mode::Smoothscroll && target)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                     ,0xa0), !bVar6)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  VVar15 = this->smoothscroll_scrolled_distance;
  local_48 = CONCAT44((this->smoothscroll_target_distance).y - VVar15.y,
                      (this->smoothscroll_target_distance).x - VVar15.x);
  uStack_40 = 0;
  VVar15 = Math::Absolute(VVar15);
  auVar19._4_4_ = dp_ratio;
  auVar19._0_4_ = dp_ratio;
  auVar19._8_4_ = dp_ratio;
  auVar19._12_4_ = dp_ratio;
  auVar17._8_8_ = uStack_40;
  auVar17._0_8_ = local_48;
  auVar17 = divps(auVar17,auVar19);
  VVar16 = Math::Absolute(auVar17._0_8_);
  local_68 = VVar16.x;
  fStack_64 = VVar16.y;
  local_a8 = auVar17._0_4_;
  uVar9 = -(uint)(0.0 < auVar17._4_4_);
  Tween::Tween((Tween *)&local_30,Exponential,Out);
  auVar18._8_8_ = extraout_XMM0_Qb;
  auVar18._0_4_ = VVar15.x;
  auVar18._4_4_ = VVar15.y;
  auVar18 = divps(auVar18,auVar19);
  auVar18 = divps(auVar18,_DAT_002cf660);
  VVar15 = Math::Min<Rml::Vector2<float>>(auVar18._0_8_,(Vector2f)0x3f8000003f800000);
  auVar4._8_8_ = extraout_XMM0_Qb_00;
  auVar4._0_4_ = VVar16.x;
  auVar4._4_4_ = VVar16.y;
  auVar18 = divps(auVar4,_DAT_002cf660);
  VVar16 = Math::Min<Rml::Vector2<float>>(auVar18._0_8_,(Vector2f)0x3f8000003f800000);
  local_78 = VVar16.x;
  fStack_74 = VVar16.y;
  local_88 = VVar15.x;
  fVar10 = Tween::operator()((Tween *)&local_30,local_88);
  fVar11 = Tween::operator()((Tween *)&local_30,local_78);
  fStack_84 = VVar15.y;
  fVar12 = Tween::operator()((Tween *)&local_30,fStack_84);
  fVar13 = Tween::operator()((Tween *)&local_30,fStack_74);
  VVar15.x = local_68 * 0.05 * local_68 + 800.0;
  VVar15.y = fStack_64 * 0.05 * fStack_64 + 800.0;
  VVar15 = Math::Min<Rml::Vector2<float>>(VVar15,(Vector2f)0x461c4000461c4000);
  dVar1 = this->previous_update_time;
  pSVar7 = GetSystemInterface();
  (*pSVar7->_vptr_SystemInterface[2])(pSVar7);
  this->previous_update_time = extraout_XMM0_Qa;
  fVar20 = (float)(extraout_XMM0_Qa - dVar1);
  fVar14 = 0.06666667;
  if (fVar20 <= 0.06666667) {
    fVar14 = fVar20;
  }
  fVar20 = (float)(-(uint)(fVar20 < 0.002) & 0x3b03126f | ~-(uint)(fVar20 < 0.002) & (uint)fVar14);
  fVar14 = this->smoothscroll_speed_factor;
  fVar10 = Math::Round((float)(-(uint)(0.0 < local_a8) & 0x3f800000 |
                              ~-(uint)(0.0 < local_a8) & -(uint)(local_a8 < 0.0) & 0xbf800000) *
                       dp_ratio * (fVar11 * fVar10 * 0.8 + 0.2) * VVar15.x * fVar14 * fVar20);
  fVar14 = Math::Round(VVar15.y *
                       (fVar13 * fVar12 * 0.8 + 0.2) *
                       (float)(uVar9 & 0x3f800000 |
                              ~uVar9 & -(uint)(auVar17._4_4_ < 0.0) & 0xbf800000) * dp_ratio *
                       fVar14 * fVar20);
  local_30.y = fVar14;
  local_30.x = fVar10;
  pTVar8 = (Tween *)&local_30;
  bVar6 = true;
  pfVar3 = (float *)&local_48;
  do {
    fVar14 = *pfVar3;
    if (fVar14 <= 0.0) {
      if (fVar14 < 0.0) {
        fVar10 = (float)pTVar8->type_in;
        if (-1.0 <= fVar10) {
          fVar10 = -1.0;
        }
        if (fVar10 <= fVar14) {
          fVar10 = fVar14;
        }
        goto LAB_00261ba7;
      }
      pTVar8->type_in = None;
    }
    else {
      fVar10 = (float)pTVar8->type_in;
      if ((float)pTVar8->type_in <= 1.0) {
        fVar10 = 1.0;
      }
      if (fVar14 <= fVar10) {
        fVar10 = fVar14;
      }
LAB_00261ba7:
      pTVar8->type_in = (Type)fVar10;
    }
    bVar5 = !bVar6;
    pTVar8 = (Tween *)&local_30.y;
    bVar6 = false;
    pfVar3 = (float *)((long)&local_48 + 4);
    if (bVar5) {
      VVar16.x = (this->smoothscroll_scrolled_distance).x + local_30.x;
      VVar16.y = (this->smoothscroll_scrolled_distance).y + local_30.y;
      this->smoothscroll_scrolled_distance = VVar16;
      PerformScrollOnTarget(this,local_30);
      fVar14 = (this->smoothscroll_target_distance).x - (this->smoothscroll_scrolled_distance).x;
      fVar10 = (this->smoothscroll_target_distance).y - (this->smoothscroll_scrolled_distance).y;
      if (fVar14 * fVar14 + fVar10 * fVar10 < 0.1) {
        this->mode = None;
        this->target = (Element *)0x0;
        (this->autoscroll_start_position).x = 0;
        (this->autoscroll_start_position).y = 0;
        (this->autoscroll_accumulated_length).x = 0.0;
        (this->autoscroll_accumulated_length).y = 0.0;
        this->autoscroll_moved = false;
        (this->smoothscroll_target_distance).x = 0.0;
        (this->smoothscroll_target_distance).y = 0.0;
        (this->smoothscroll_scrolled_distance).x = 0.0;
        (this->smoothscroll_scrolled_distance).y = 0.0;
      }
      return;
    }
  } while( true );
}

Assistant:

void ScrollController::UpdateSmoothscroll(float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Smoothscroll && target);

	const Vector2f target_delta = Vector2f(smoothscroll_target_distance - smoothscroll_scrolled_distance);
	const Vector2f velocity = CalculateSmoothscrollVelocity(target_delta, smoothscroll_scrolled_distance, dp_ratio);

	const float dt = UpdateTime();
	Vector2f scroll_distance = (smoothscroll_speed_factor * velocity * dt).Round();

	for (int i = 0; i < 2; i++)
	{
		// Ensure minimum scroll speed of 1px/frame, and clamp the distance to the target in case of overshooting
		// integration. As opposed to autoscroll, we don't care about fractional speeds here since we want to be fast.
		if (target_delta[i] > 0.f)
			scroll_distance[i] = Math::Min(Math::Max(scroll_distance[i], 1.f), target_delta[i]);
		else if (target_delta[i] < 0.f)
			scroll_distance[i] = Math::Max(Math::Min(scroll_distance[i], -1.f), target_delta[i]);
		else
			scroll_distance[i] = 0.f;
	}

#if 0
	// Useful debugging output for velocity model tuning.
	Log::Message(Log::LT_INFO, "Scroll  y0 %8.2f   y1 %8.2f   v %8.2f   d %8.2f", smoothscroll_scrolled_distance.y, target_delta.y, velocity.y,
		scroll_distance.y);
#endif

	smoothscroll_scrolled_distance += scroll_distance;
	PerformScrollOnTarget(scroll_distance);

	if (HasSmoothscrollReachedTarget())
		Reset();
}